

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall Qclass_detAction_Test::TestBody(Qclass_detAction_Test *this)

{
  char *pcVar1;
  undefined1 auStack_15fe8 [8];
  Qclass Test;
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  memset(auStack_15fe8 + 4,0,10000);
  memset(Test.grid[0x31] + 0x31,0,0x13881);
  Test._90004_8_ = 3;
  Test.goal_y = 0;
  Test._90020_4_ = 0x3fe00000;
  Test.learn_rate = 0.8;
  gtest_ar.message_.ptr_._0_4_ = Qclass::detAction((Qclass *)auStack_15fe8,2);
  local_18.data_._0_4_ = 4;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)&Test.disc_rew,"Test.detAction(2)","4",(int *)&gtest_ar.message_,
             (int *)&local_18);
  if (Test.disc_rew._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x18,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar.message_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  gtest_ar.message_.ptr_._0_4_ = Qclass::detAction((Qclass *)auStack_15fe8,3);
  local_18.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperGT<int,int>
            ((internal *)&Test.disc_rew,"Test.detAction(3)","-1",(int *)&gtest_ar.message_,
             (int *)&local_18);
  if (Test.disc_rew._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x19,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar.message_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  Qclass::~Qclass((Qclass *)auStack_15fe8);
  return;
}

Assistant:

TEST(Qclass, detAction) {
  Qclass Test;
  EXPECT_LT(Test.detAction(2), 4);
  EXPECT_GT(Test.detAction(3), -1);
}